

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O3

size_t json_dumpb(json_t *json,char *buffer,size_t size,size_t flags)

{
  int iVar1;
  size_t sVar2;
  buffer buf;
  size_t local_20;
  size_t local_18;
  char *local_10;
  
  local_18 = 0;
  if ((((uint)flags >> 9 & 1) == 0) && ((json == (json_t *)0x0 || (JSON_ARRAY < json->type)))) {
    sVar2 = 0;
  }
  else {
    local_20 = size;
    local_10 = buffer;
    iVar1 = do_dump(json,flags,0,dump_to_buffer,&local_20);
    sVar2 = 0;
    if (iVar1 == 0) {
      sVar2 = local_18;
    }
  }
  return sVar2;
}

Assistant:

size_t json_dumpb(const json_t *json, char *buffer, size_t size, size_t flags)
{
	struct buffer buf = { size, 0, buffer };

	if (json_dump_callback(json, dump_to_buffer, (void *)&buf, flags))
		return 0;

	return buf.used;
}